

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O3

void merge_table(ecs_world_t *world,ecs_table_t *dst_table,ecs_table_t *src_table,
                ecs_entities_t *to_add,ecs_entities_t *to_remove)

{
  int32_t row;
  int32_t count;
  ecs_data_t *peVar1;
  ecs_data_t *new_data;
  
  if (dst_table->type != (ecs_type_t)0x0) {
    if (dst_table != src_table) {
      peVar1 = ecs_table_get_data(src_table);
      row = ecs_table_count(dst_table);
      count = ecs_table_count(src_table);
      if ((to_remove != (ecs_entities_t *)0x0) &&
         (peVar1 != (ecs_data_t *)0x0 && to_remove->count != 0)) {
        ecs_run_remove_actions(world,src_table,peVar1,0,count,to_remove,false);
      }
      new_data = ecs_table_get_data(dst_table);
      peVar1 = ecs_table_merge(world,dst_table,src_table,new_data,peVar1);
      if ((to_add != (ecs_entities_t *)0x0) && (peVar1 != (ecs_data_t *)0x0 && to_add->count != 0))
      {
        ecs_run_add_actions(world,dst_table,peVar1,row,count,to_add,false,true);
      }
    }
    return;
  }
  ecs_table_clear(world,src_table);
  return;
}

Assistant:

static
void merge_table(
    ecs_world_t *world,
    ecs_table_t *dst_table,
    ecs_table_t *src_table,
    ecs_entities_t *to_add,
    ecs_entities_t *to_remove)
{    
    if (!dst_table->type) {
        /* If this removes all components, clear table */
        ecs_table_clear(world, src_table);
    } else {
        /* Merge table into dst_table */
        if (dst_table != src_table) {
            ecs_data_t *src_data = ecs_table_get_data(src_table);
            int32_t dst_count = ecs_table_count(dst_table);
            int32_t src_count = ecs_table_count(src_table);

            if (to_remove && to_remove->count && src_data) {
                ecs_run_remove_actions(world, src_table, 
                    src_data, 0, src_count, to_remove, false);
            }

            ecs_data_t *dst_data = ecs_table_get_data(dst_table);
            dst_data = ecs_table_merge(
                world, dst_table, src_table, dst_data, src_data);

            if (to_add && to_add->count && dst_data) {
                ecs_run_add_actions(world, dst_table, dst_data, 
                    dst_count, src_count, to_add, false, true);
            }
        }
    }
}